

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# easylogging++.cc
# Opt level: O0

void __thiscall el::Logger::resolveLoggerFormatSpec(Logger *this)

{
  EnumType lIndex;
  function<bool_()> *in_stack_ffffffffffffff98;
  EnumType *startIndex;
  function<bool_()> *in_stack_ffffffffffffffb0;
  anon_class_16_2_455e6bc1 local_30 [2];
  EnumType local_c [3];
  
  local_c[0] = 2;
  startIndex = local_c;
  std::function<bool()>::function<el::Logger::resolveLoggerFormatSpec()const::__0,void>
            (in_stack_ffffffffffffffb0,local_30);
  LevelHelper::forEachLevel(startIndex,in_stack_ffffffffffffff98);
  el::base::utils::std::function<bool_()>::~function((function<bool_()> *)0x227df9);
  return;
}

Assistant:

void Logger::resolveLoggerFormatSpec(void) const {
  base::type::EnumType lIndex = LevelHelper::kMinValid;
  LevelHelper::forEachLevel(&lIndex, [&](void) -> bool {
    base::LogFormat* logFormat =
    const_cast<base::LogFormat*>(&m_typedConfigurations->logFormat(LevelHelper::castFromInt(lIndex)));
    base::utils::Str::replaceFirstWithEscape(logFormat->m_format, base::consts::kLoggerIdFormatSpecifier, m_id);
    return false;
  });
}